

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

optional<pbrt::SampledGrid<float>_> * __thiscall
pstd::optional<pbrt::SampledGrid<float>_>::operator=
          (optional<pbrt::SampledGrid<float>_> *this,SampledGrid<float> *v)

{
  reset(this);
  pbrt::SampledGrid<float>::SampledGrid((SampledGrid<float> *)this,v);
  this->set = true;
  return this;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(T &&v) {
        reset();
        new (ptr()) T(std::move(v));
        set = true;
        return *this;
    }